

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O3

void __thiscall
lzham::search_accelerator::search_accelerator
          (search_accelerator *this,lzham_malloc_context malloc_context)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  void *in_RDX;
  void *extraout_RDX;
  
  this->m_malloc_context = malloc_context;
  this->m_pLZBase = (CLZBase *)0x0;
  this->m_pTask_pool = (task_pool *)0x0;
  this->m_max_helper_threads = 0;
  this->m_max_dict_size = 0;
  this->m_max_dict_size_mask = 0;
  this->m_lookahead_pos = 0;
  this->m_lookahead_size = 0;
  this->m_cur_dict_size = 0;
  (this->m_dict).m_p = (uchar *)0x0;
  (this->m_dict).m_size = 0;
  (this->m_dict).m_capacity = 0;
  (this->m_dict).m_malloc_context = malloc_context;
  (this->m_hash).m_p = (uint *)0x0;
  (this->m_hash).m_size = 0;
  (this->m_hash).m_capacity = 0;
  (this->m_hash).m_malloc_context = malloc_context;
  (this->m_nodes).m_p = (node *)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_nodes).m_malloc_context = malloc_context;
  (this->m_matches).m_p = (dict_match *)0x0;
  (this->m_matches).m_size = 0;
  (this->m_matches).m_capacity = 0;
  (this->m_matches).m_malloc_context = malloc_context;
  (this->m_match_refs).m_p = (long *)0x0;
  (this->m_match_refs).m_size = 0;
  (this->m_match_refs).m_capacity = 0;
  (this->m_match_refs).m_malloc_context = malloc_context;
  (this->m_digram_hash).m_p = (uint *)0x0;
  (this->m_digram_hash).m_size = 0;
  (this->m_digram_hash).m_capacity = 0;
  (this->m_digram_hash).m_malloc_context = malloc_context;
  (this->m_digram_next).m_p = (uint *)0x0;
  (this->m_digram_next).m_size = 0;
  (this->m_digram_next).m_capacity = 0;
  (this->m_digram_next).m_malloc_context = malloc_context;
  lVar3 = 0xd8;
  do {
    puVar1 = (undefined8 *)((long)&this->m_malloc_context + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&this->m_pTask_pool + lVar3) = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x3d8);
  this->m_fill_lookahead_pos = 0;
  this->m_fill_lookahead_size = 0;
  this->m_fill_dict_size = 0;
  this->m_max_probes = 0;
  this->m_max_matches = 0;
  this->m_all_matches = false;
  this->m_deterministic = false;
  this->m_len2_matches = false;
  this->m_hash24 = false;
  this->m_next_match_ref = 0;
  this->m_num_completed_helper_threads = 0;
  lVar3 = 0xe8;
  do {
    pvVar2 = *(void **)((long)this + lVar3 + -0x10);
    if (pvVar2 != (void *)0x0) {
      lzham::lzham_free(*(lzham **)((long)&this->m_malloc_context + lVar3),pvVar2,in_RDX);
      *(undefined8 *)((long)this + lVar3 + -0x10) = 0;
      *(undefined8 *)((long)this + lVar3 + -8) = 0;
      in_RDX = extraout_RDX;
    }
    *(lzham_malloc_context *)((long)&this->m_malloc_context + lVar3) = malloc_context;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 1000);
  return;
}

Assistant:

search_accelerator::search_accelerator(lzham_malloc_context malloc_context) :
      m_malloc_context(malloc_context),
      m_pLZBase(NULL),
      m_pTask_pool(NULL),
      m_max_helper_threads(0),
      m_max_dict_size(0),
      m_max_dict_size_mask(0),
      m_lookahead_pos(0),
      m_lookahead_size(0),
      m_cur_dict_size(0),
      m_dict(malloc_context), 
      m_hash(malloc_context), 
      m_nodes(malloc_context), 
      m_matches(malloc_context), 
      m_match_refs(malloc_context), 
      m_digram_hash(malloc_context),
      m_digram_next(malloc_context),
      m_fill_lookahead_pos(0),
      m_fill_lookahead_size(0),
      m_fill_dict_size(0),
      m_max_probes(0),
      m_max_matches(0),
      m_all_matches(false),
      m_deterministic(false),
      m_len2_matches(false),
      m_hash24(false),
      m_next_match_ref(0),
      m_num_completed_helper_threads(0)
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_thread_dict_offsets); i++)
         m_thread_dict_offsets[i].set_malloc_context(malloc_context);
   }